

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O3

reverse_iterator * __thiscall
llvm::sys::path::rbegin
          (reverse_iterator *__return_storage_ptr__,path *this,StringRef Path,Style style)

{
  reverse_iterator local_40;
  
  local_40.Path.Length = (size_t)Path.Data;
  local_40.Component.Data = (char *)0x0;
  local_40.Component.Length = 0;
  local_40.S = (Style)Path.Length;
  local_40.Path.Data = (char *)this;
  local_40.Position = local_40.Path.Length;
  reverse_iterator::operator++(&local_40);
  (__return_storage_ptr__->Path).Data = local_40.Path.Data;
  (__return_storage_ptr__->Path).Length = local_40.Path.Length;
  (__return_storage_ptr__->Component).Data = local_40.Component.Data;
  (__return_storage_ptr__->Component).Length = local_40.Component.Length;
  __return_storage_ptr__->Position = local_40.Position;
  *(ulong *)&__return_storage_ptr__->S = CONCAT44(local_40._44_4_,local_40.S);
  return __return_storage_ptr__;
}

Assistant:

reverse_iterator rbegin(StringRef Path, Style style) {
  reverse_iterator I;
  I.Path = Path;
  I.Position = Path.size();
  I.S = style;
  return ++I;
}